

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O3

void __thiscall irr::COSOperator::COSOperator(COSOperator *this,void **vtt,stringc *osVersion)

{
  _func_int **pp_Var1;
  undefined1 *puVar2;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IOSOperator)._vptr_IOSOperator = pp_Var1;
  *(void **)((long)&(this->super_IOSOperator)._vptr_IOSOperator + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IOSOperator)._vptr_IOSOperator = pp_Var1;
  *(void **)((long)&(this->super_IOSOperator)._vptr_IOSOperator + (long)pp_Var1[-3]) = vtt[3];
  puVar2 = &(this->super_IOSOperator).field_0x8;
  *(undefined1 **)&(this->super_IOSOperator).field_0x8 = &(this->super_IOSOperator).field_0x18;
  *(undefined8 *)&(this->super_IOSOperator).field_0x10 = 0;
  (this->super_IOSOperator).field_0x18 = 0;
  if ((stringc *)puVar2 != osVersion) {
    ::std::__cxx11::string::_M_assign((string *)puVar2);
  }
  this->ClipboardSelectionText = (char *)0x0;
  this->PrimarySelectionText = (char *)0x0;
  return;
}

Assistant:

COSOperator::COSOperator(const core::stringc &osVersion) :
		OperatingSystem(osVersion)
{
#ifdef _DEBUG
	setDebugName("COSOperator");
#endif
}